

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

int ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int extraout_EAX;
  string *psVar1;
  Reporter *siglen_00;
  StringWriter writer;
  undefined1 local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8 [4];
  string local_98;
  string local_78;
  StringWriter local_58;
  
  Options::scrub(&local_78,(Options *)sig,(string *)ctx);
  Options::fileOptions((FileOptions *)local_c0,(Options *)sig);
  psVar1 = Options::FileOptions::getFileExtension_abi_cxx11_((FileOptions *)local_c0);
  ::std::__cxx11::string::string((string *)&local_98,(string *)psVar1);
  StringWriter::StringWriter(&local_58,&local_78,&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)local_b8);
  ::std::__cxx11::string::~string((string *)&local_78);
  Options::getNamer((Options *)local_c0);
  siglen_00 = Options::getReporter((Options *)sig);
  FileApprover::verify((EVP_PKEY_CTX *)local_c0,(uchar *)&local_58,(size_t)siglen_00,tbs,tbslen);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b8);
  StringWriter::~StringWriter(&local_58);
  return extraout_EAX;
}

Assistant:

static void verify(const std::string& contents,
                           const Options& options = Options())
        {
            StringWriter writer(options.scrub(contents),
                                options.fileOptions().getFileExtension());
            FileApprover::verify(*options.getNamer(), writer, options.getReporter());
        }